

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GeometryShaderGetProgramiv2Test::iterate(GeometryShaderGetProgramiv2Test *this)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  char *description;
  long lVar7;
  qpTestResult testResult;
  GLint rv;
  GLenum pnames [4];
  char *specialized_dummy_vs_raw;
  char *specialized_dummy_fs_raw;
  string specialized_dummy_vs;
  string specialized_dummy_fs;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar6;
  
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  pnames[0] = (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_LINKED_VERTICES_OUT;
  pnames[1] = (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_LINKED_INPUT_TYPE;
  pnames[2] = (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_LINKED_OUTPUT_TYPE;
  pnames[3] = (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER_INVOCATIONS;
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
               ,0x27c);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  TestCaseBase::specializeShader_abi_cxx11_
            (&specialized_dummy_fs,&this->super_TestCaseBase,1,&dummy_fs_code);
  specialized_dummy_fs_raw = specialized_dummy_fs._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (&specialized_dummy_vs,&this->super_TestCaseBase,1,&dummy_vs_code);
  specialized_dummy_vs_raw = specialized_dummy_vs._M_dataplus._M_p;
  GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar4;
  GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar4;
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x28a);
  GVar4 = (**(code **)(lVar6 + 0x3c8))();
  this->m_po_id = GVar4;
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glCreateProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x28e);
  bVar2 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,
                     &specialized_dummy_fs_raw,this->m_vs_id,1,&specialized_dummy_vs_raw,(bool *)0x0
                    );
  if (bVar2) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    bVar2 = true;
    lVar7 = 0;
    do {
      rv = -1;
      (**(code **)(lVar6 + 0x9d8))(this->m_po_id,pnames[lVar7],&rv);
      iVar3 = (**(code **)(lVar6 + 0x800))();
      if (iVar3 != 0x502) {
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"No error generated by glGetProgramiv() for pname [",0x32);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar2 = false;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    if (bVar2) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_00cf3a75;
    }
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Failed to build a dummy test program object",0x2b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00cf3a75:
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,testResult,
             description);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)specialized_dummy_vs._M_dataplus._M_p != &specialized_dummy_vs.field_2) {
    operator_delete(specialized_dummy_vs._M_dataplus._M_p,
                    specialized_dummy_vs.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)specialized_dummy_fs._M_dataplus._M_p != &specialized_dummy_fs.field_2) {
    operator_delete(specialized_dummy_fs._M_dataplus._M_p,
                    specialized_dummy_fs.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderGetProgramiv2Test::iterate()
{
	const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
	const glw::GLenum pnames[] = { m_glExtTokens.GEOMETRY_LINKED_VERTICES_OUT, m_glExtTokens.GEOMETRY_LINKED_INPUT_TYPE,
								   m_glExtTokens.GEOMETRY_LINKED_OUTPUT_TYPE,
								   m_glExtTokens.GEOMETRY_SHADER_INVOCATIONS };
	const unsigned int n_pnames = sizeof(pnames) / sizeof(pnames[0]);
	bool			   result   = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Initialize the program object */
	std::string specialized_dummy_fs = specializeShader(1,
														/* parts */ &dummy_fs_code);
	const char* specialized_dummy_fs_raw = specialized_dummy_fs.c_str();
	std::string specialized_dummy_vs	 = specializeShader(1,
														/* parts */ &dummy_vs_code);
	const char* specialized_dummy_vs_raw = specialized_dummy_vs.c_str();

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	m_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	if (!TestCaseBase::buildProgram(m_po_id, m_fs_id, 1, &specialized_dummy_fs_raw, m_vs_id, 1,
									&specialized_dummy_vs_raw))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Failed to build a dummy test program object"
						   << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Verify that GS-specific queries cause a GL_INVALID_OPERATION error
	 * for a linked PO lacking the GS stage.
	 */
	for (unsigned int n_pname = 0; n_pname < n_pnames; ++n_pname)
	{
		glw::GLenum error_code = GL_NO_ERROR;
		glw::GLenum pname	  = pnames[n_pname];
		glw::GLint  rv		   = -1;

		gl.getProgramiv(m_po_id, pname, &rv);

		error_code = gl.getError();

		if (error_code != GL_INVALID_OPERATION)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "No error generated by glGetProgramiv() for pname [" << pname
							   << "]" << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all pnames) */

end:
	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}